

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void DoIt(int maxIntensityBinIdx,bool hasIntensityUncertainty,char *binFileName,char *idxFileName,
         bool uncompressedSize,bool zip,bool validationCheck)

{
  undefined1 local_30e8 [8];
  FootprintToBin fTB;
  bool validationCheck_local;
  bool zip_local;
  bool uncompressedSize_local;
  char *idxFileName_local;
  char *binFileName_local;
  bool hasIntensityUncertainty_local;
  int maxIntensityBinIdx_local;
  
  fTB.eventRows_.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._5_1_ = validationCheck;
  fTB.eventRows_.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = zip;
  fTB.eventRows_.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = uncompressedSize;
  FootprintToBin::FootprintToBin
            ((FootprintToBin *)local_30e8,maxIntensityBinIdx,hasIntensityUncertainty,binFileName,
             idxFileName,uncompressedSize,zip,validationCheck);
  Validate::SkipHeaderRow((Validate *)&fTB);
  FootprintToBin::WriteHeader((FootprintToBin *)local_30e8);
  if ((fTB.eventRows_.super__Vector_base<EventRow,_std::allocator<EventRow>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage._5_1_ & 1) == 0) {
    FootprintToBin::ReadFootprintFileNoChecks((FootprintToBin *)local_30e8);
  }
  else {
    ValidateFootprint::ReadFootprintFile((ValidateFootprint *)local_30e8);
    Validate::PrintSuccessMessage((Validate *)&fTB);
  }
  FootprintToBin::~FootprintToBin((FootprintToBin *)local_30e8);
  return;
}

Assistant:

void DoIt(const int maxIntensityBinIdx, const bool hasIntensityUncertainty,
	  const char* binFileName, const char* idxFileName,
	  const bool uncompressedSize, const bool zip,
	  const bool validationCheck) {

  FootprintToBin fTB(maxIntensityBinIdx, hasIntensityUncertainty, binFileName,
		     idxFileName, uncompressedSize, zip, validationCheck);
  fTB.SkipHeaderRow();
  fTB.WriteHeader();

  if (validationCheck) {

    fTB.ReadFootprintFile();
    fTB.PrintSuccessMessage();

    return;

  }

  fTB.ReadFootprintFileNoChecks();

}